

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status google::protobuf::(anonymous_namespace)::
       Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                 (char *args,basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2,
                 basic_string_view<char,_std::char_traits<char>_> args_3,char *args_4)

{
  string_view message;
  string local_140;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_60.piece_ = absl::lts_20250127::NullSafeStringView((Nullable<const_char_*>)args_1._M_len);
  local_90.piece_._M_len = (size_t)args_1._M_str;
  local_90.piece_._M_str = args_2;
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView((Nullable<const_char_*>)args_3._M_len);
  local_f0.piece_._M_len = (size_t)args_4;
  local_120.piece_ = absl::lts_20250127::NullSafeStringView(args_3._M_str);
  absl::lts_20250127::StrCat<>(&local_140,&local_60,&local_90,&local_c0,&local_f0,&local_120);
  message._M_str = (char *)local_140._M_string_length;
  message._M_len = (size_t)args;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_140);
  return (Status)(uintptr_t)args;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}